

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::RuntimeCharTrie::CloneFrom
          (RuntimeCharTrie *this,ScriptContext *scriptContext,ArenaAllocator *allocator,
          CharTrie *other)

{
  int iVar1;
  CharTrieEntry *pCVar2;
  RuntimeCharTrieEntry *pRVar3;
  long lVar4;
  int i;
  long lVar5;
  long lVar6;
  
  ThreadContext::ProbeStackNoDispose(scriptContext->threadContext,0x6000,scriptContext,(PVOID)0x0);
  iVar1 = other->count;
  this->count = iVar1;
  if ((long)iVar1 < 1) {
    this->children = (RuntimeCharTrieEntry *)0x0;
  }
  else {
    pRVar3 = Memory::AllocateArray<Memory::ArenaAllocator,UnifiedRegex::RuntimeCharTrieEntry,false>
                       ((Memory *)allocator,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                        (long)iVar1);
    this->children = pRVar3;
    lVar4 = 8;
    lVar6 = lVar4;
    for (lVar5 = 0; lVar5 < this->count; lVar5 = lVar5 + 1) {
      pCVar2 = other->children;
      pRVar3 = this->children;
      *(undefined2 *)((long)pRVar3 + lVar4 + -8) = *(undefined2 *)((long)pCVar2 + lVar6 + -8);
      CloneFrom((RuntimeCharTrie *)((long)&pRVar3->c + lVar4),scriptContext,allocator,
                (CharTrie *)((long)&pCVar2->c + lVar6));
      lVar6 = lVar6 + 0x20;
      lVar4 = lVar4 + 0x18;
    }
  }
  return;
}

Assistant:

void RuntimeCharTrie::CloneFrom(Js::ScriptContext* scriptContext, ArenaAllocator* allocator, const CharTrie& other)
    {
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackRegex);
        count = other.count;
        if (count > 0)
        {
            children = AnewArray(allocator, RuntimeCharTrieEntry, count);
            for (int i = 0; i < count; i++)
            {
                children[i].c = other.children[i].c;
                children[i].node.CloneFrom(scriptContext, allocator,  other.children[i].node);
            }
        }
        else
            children = 0;
    }